

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_subquery_expression.cpp
# Opt level: O3

BindResult * __thiscall
duckdb::ExpressionBinder::BindExpression
          (BindResult *__return_storage_ptr__,ExpressionBinder *this,SubqueryExpression *expr,
          idx_t depth)

{
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *expr_00
  ;
  SubqueryType SVar1;
  ExpressionType EVar2;
  pointer pcVar3;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var4;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var5;
  ClientContext *context;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var6;
  _Head_base<0UL,_duckdb::BoundQueryNode_*,_false> _Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  string sVar12;
  bool bVar13;
  pointer pSVar14;
  pointer pQVar15;
  Binder *pBVar16;
  reference pvVar17;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var18;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> this_00;
  BoundSubqueryNode *pBVar19;
  type expr_01;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *child;
  pointer pBVar20;
  reference pvVar21;
  BoundSubqueryExpression *this_01;
  reference this_02;
  type expr_02;
  pointer pBVar22;
  BinderException *pBVar23;
  unsigned_long params_1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var24;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  size_type __n;
  ulong __n_00;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  child_expressions;
  CorrelatedColumnInfo corr;
  LogicalType child_type;
  LogicalType compare_type;
  _Head_base<0UL,_duckdb::BoundSubqueryExpression_*,_false> local_220;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_218;
  SubqueryExpression *local_210;
  undefined1 local_208 [56];
  _Head_base<0UL,_duckdb::Expression_*,_false> local_1d0;
  undefined1 local_1c8 [32];
  undefined1 local_1a8 [16];
  undefined1 local_198 [24];
  string local_180 [8];
  optional_idx local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_160 [8];
  element_type *local_120;
  LogicalType local_118;
  LogicalType local_100;
  string local_e8;
  LogicalType local_c8;
  ErrorData local_b0;
  
  p_Var24 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&expr->subquery;
  local_210 = expr;
  local_208._40_8_ = this;
  local_1c8._24_8_ = __return_storage_ptr__;
  pSVar14 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
            ::operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                          *)p_Var24);
  pQVar15 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator->
                      (&pSVar14->node);
  if (pQVar15->type != BOUND_SUBQUERY_NODE) {
    Binder::CreateBinder
              ((Binder *)local_208,*(ClientContext **)(local_208._40_8_ + 0x40),
               *(Binder **)(local_208._40_8_ + 0x38),REGULAR_BINDER);
    pBVar16 = shared_ptr<duckdb::Binder,_true>::operator->
                        ((shared_ptr<duckdb::Binder,_true> *)local_208);
    pBVar16->can_contain_nulls = true;
    local_218 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)depth;
    pBVar16 = shared_ptr<duckdb::Binder,_true>::operator->
                        ((shared_ptr<duckdb::Binder,_true> *)local_208);
    pSVar14 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
              ::operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                            *)p_Var24);
    unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator*
              (&pSVar14->node);
    Binder::BindNode((Binder *)local_1c8,(QueryNode *)pBVar16);
    for (__n_00 = 0;
        pBVar16 = shared_ptr<duckdb::Binder,_true>::operator->
                            ((shared_ptr<duckdb::Binder,_true> *)local_208),
        __n_00 < (ulong)(((long)(pBVar16->correlated_columns).
                                super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                                .
                                super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pBVar16->correlated_columns).
                                super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                                .
                                super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4) *
                        -0x3333333333333333); __n_00 = __n_00 + 1) {
      pBVar16 = shared_ptr<duckdb::Binder,_true>::operator->
                          ((shared_ptr<duckdb::Binder,_true> *)local_208);
      pvVar17 = vector<duckdb::CorrelatedColumnInfo,_true>::operator[]
                          (&pBVar16->correlated_columns,__n_00);
      local_1a8._0_8_ = (pvVar17->binding).table_index;
      local_1a8._8_8_ = (pvVar17->binding).column_index;
      LogicalType::LogicalType((LogicalType *)local_198,&pvVar17->type);
      pcVar3 = (pvVar17->name)._M_dataplus._M_p;
      local_180 = (string  [8])&local_170;
      ::std::__cxx11::string::_M_construct<char*>
                (local_180,pcVar3,pcVar3 + (pvVar17->name)._M_string_length);
      local_160[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pvVar17->depth;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&DAT_00000001 < local_160[0]._M_pi) {
        local_160[0]._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&local_160[0]._M_pi[-1]._M_weak_count + 3);
        Binder::AddCorrelatedColumn
                  (*(Binder **)(local_208._40_8_ + 0x38),(CorrelatedColumnInfo *)local_1a8);
      }
      if (local_180 != (string  [8])&local_170) {
        operator_delete((void *)local_180);
      }
      LogicalType::~LogicalType((LogicalType *)local_198);
    }
    _Var4._M_head_impl =
         (((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
            *)p_Var24)->
         super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
         .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
    (((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true> *)
     p_Var24)->
    super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>)._M_t.
    super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
    .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = (SelectStatement *)0x0;
    _Var18._M_head_impl = (SelectStatement *)operator_new(0x80);
    ((_Var18._M_head_impl)->super_SQLStatement).type = SELECT_STATEMENT;
    ((_Var18._M_head_impl)->super_SQLStatement).stmt_location = 0;
    ((_Var18._M_head_impl)->super_SQLStatement).stmt_length = 0;
    ((_Var18._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_buckets =
         &((_Var18._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_single_bucket;
    ((_Var18._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_bucket_count = 1;
    ((_Var18._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)0x0;
    ((_Var18._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_element_count = 0;
    ((_Var18._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_rehash_policy.
    _M_max_load_factor = 1.0;
    ((_Var18._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_rehash_policy._M_next_resize
         = 0;
    ((_Var18._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_single_bucket =
         (__node_base_ptr)0x0;
    ((_Var18._M_head_impl)->super_SQLStatement).query._M_dataplus =
         (_Alloc_hider)&((_Var18._M_head_impl)->super_SQLStatement).query.field_2;
    ((_Var18._M_head_impl)->super_SQLStatement).query._M_string_length = 0;
    ((_Var18._M_head_impl)->super_SQLStatement).query.field_2._M_local_buf[0] = '\0';
    ((_Var18._M_head_impl)->super_SQLStatement)._vptr_SQLStatement = &PTR__SelectStatement_01981db8;
    ((_Var18._M_head_impl)->node).
    super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_> =
         (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)0x0;
    (((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true> *)
     p_Var24)->
    super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>)._M_t.
    super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
    .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = _Var18._M_head_impl;
    this_00._M_head_impl = (QueryNode *)operator_new(0x98);
    uVar11 = local_1c8._0_8_;
    uVar10 = local_208._8_8_;
    uVar9 = local_208._0_8_;
    local_208._0_8_ = (element_type *)0x0;
    local_208._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1c8._0_8_ = (element_type *)0x0;
    QueryNode::QueryNode(this_00._M_head_impl,BOUND_SUBQUERY_NODE);
    (this_00._M_head_impl)->_vptr_QueryNode = (_func_int **)&PTR__BoundSubqueryNode_0197cd78;
    this_00._M_head_impl[1]._vptr_QueryNode = (_func_int **)uVar9;
    *(undefined8 *)&this_00._M_head_impl[1].type = uVar10;
    this_00._M_head_impl[1].modifiers.
    super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)uVar11;
    this_00._M_head_impl[1].modifiers.
    super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)_Var4._M_head_impl;
    pSVar14 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
              ::operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                            *)p_Var24);
    _Var5._M_head_impl =
         (pSVar14->node).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pSVar14->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
    _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = this_00._M_head_impl;
    if (_Var5._M_head_impl != (QueryNode *)0x0) {
      (**(code **)((long)(_Var5._M_head_impl)->_vptr_QueryNode + 8))();
    }
    depth = (idx_t)local_218;
    if ((element_type *)local_1c8._0_8_ != (element_type *)0x0) {
      (**(code **)&((((_Tuple_impl<0UL,_duckdb::ResultModifier_*,_std::default_delete<duckdb::ResultModifier>_>
                       *)&(((enable_shared_from_this<duckdb::Binder> *)local_1c8._0_8_)->
                          __weak_this_).internal.
                          super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super__Head_base<0UL,_duckdb::ResultModifier_*,_false>)._M_head_impl)->type)();
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_);
    }
  }
  expr_00 = &local_210->child;
  if ((local_210->child).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0) {
    Bind((ErrorData *)local_1a8,(ExpressionBinder *)local_208._40_8_,expr_00,depth,false);
    uVar9 = local_1a8._0_8_;
    sVar12 = local_1a8[0];
    if (local_1a8[0] == (string)0x1) {
      local_b0.initialized = (bool)local_1a8[0];
      local_b0.type = local_1a8[1];
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_ ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_198 + 8)) {
        local_b0.raw_message.field_2._8_4_ = local_198._16_4_;
        local_b0.raw_message.field_2._12_4_ = local_198._20_4_;
        local_b0.raw_message._M_dataplus._M_p = (pointer)((long)&local_b0 + 0x18U);
      }
      else {
        local_b0.raw_message._M_dataplus._M_p = (pointer)local_1a8._8_8_;
      }
      local_b0.raw_message._M_string_length = local_198._0_8_;
      local_198._0_8_ = (ClientContext *)0x0;
      local_198._8_4_ = local_198._8_4_ & 0xffffff00;
      if (local_180 == (string  [8])&local_170) {
        local_b0.final_message.field_2._8_4_ = local_170._8_4_;
        local_b0.final_message.field_2._12_4_ = local_170._12_4_;
        local_b0.final_message._M_dataplus._M_p = (pointer)((long)&local_b0 + 0x38U);
      }
      else {
        local_b0.final_message._M_dataplus._M_p = (pointer)local_180;
      }
      local_b0.final_message._M_string_length = local_178.index;
      local_178.index = 0;
      local_170._M_allocated_capacity._0_4_ = local_170._M_allocated_capacity._0_4_ & 0xffffff00;
      local_218 = p_Var24;
      local_1a8._0_8_ = uVar9;
      local_1a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_198 + 8);
      local_180 = (string  [8])&local_170;
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)((long)&local_b0 + 0x48),local_160);
      BindResult::BindResult((BindResult *)local_1c8._24_8_,&local_b0);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)((long)&local_b0 + 0x48));
      if (local_b0.final_message._M_dataplus._M_p != (pointer)((long)&local_b0 + 0x38U)) {
        operator_delete(local_b0.final_message._M_dataplus._M_p);
      }
      p_Var24 = local_218;
      if (local_b0.raw_message._M_dataplus._M_p != (pointer)((long)&local_b0 + 0x18U)) {
        operator_delete(local_b0.raw_message._M_dataplus._M_p);
      }
    }
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_160);
    if (local_180 != (string  [8])&local_170) {
      operator_delete((void *)local_180);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_198 + 8)) {
      operator_delete((void *)local_1a8._8_8_);
    }
    if (sVar12 != (string)0x0) {
      return (BindResult *)local_1c8._24_8_;
    }
  }
  pSVar14 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
            ::operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                          *)p_Var24);
  pQVar15 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator->
                      (&pSVar14->node);
  pBVar19 = QueryNode::Cast<duckdb::BoundSubqueryNode>(pQVar15);
  local_208._0_8_ = (element_type *)0x0;
  local_208._8_8_ = (element_type *)0x0;
  local_208._16_8_ = (ClientContext *)0x0;
  if (local_210->subquery_type == EXISTS) {
    bVar13 = false;
  }
  else {
    if ((expr_00->
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl ==
        (ParsedExpression *)0x0) {
      params_1 = 1;
    }
    else {
      expr_01 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator*(expr_00);
      child = BoundExpression::GetExpression(expr_01);
      pBVar20 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                ::operator->(&pBVar19->bound_node);
      ExtractSubqueryChildren
                (child,(vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                        *)local_208,&pBVar20->types);
      if (local_208._0_8_ == local_208._8_8_) {
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)local_208,child);
      }
      params_1 = (long)(local_208._8_8_ - local_208._0_8_) >> 3;
    }
    pBVar20 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              ::operator->(&pBVar19->bound_node);
    if (((long)(pBVar20->types).
               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_finish -
         (long)(pBVar20->types).
               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - params_1 != 0) {
      pBVar23 = (BinderException *)__cxa_allocate_exception(0x10);
      local_1a8._0_8_ = local_198;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"Subquery returns %zu columns - expected %d","");
      pBVar20 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                ::operator->(&pBVar19->bound_node);
      BinderException::BinderException<unsigned_long,unsigned_long>
                (pBVar23,&local_210->super_ParsedExpression,(string *)local_1a8,
                 ((long)(pBVar20->types).
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pBVar20->types).
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
                 params_1);
      __cxa_throw(pBVar23,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    bVar13 = local_210->subquery_type == SCALAR;
  }
  local_120 = (pBVar19->subquery_binder).internal.
              super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_218 = (pBVar19->subquery_binder).internal.
              super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pBVar19->subquery_binder).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (pBVar19->subquery_binder).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_208._32_8_ =
       (pBVar19->bound_node).
       super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t.
       super___uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>
       .super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl;
  (pBVar19->bound_node).
  super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>.
  super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl = (BoundQueryNode *)0x0;
  if (bVar13) {
    pBVar20 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                            *)(local_208 + 0x20));
    pvVar21 = vector<duckdb::LogicalType,_true>::operator[](&pBVar20->types,0);
    LogicalType::LogicalType((LogicalType *)local_1c8,pvVar21);
  }
  else {
    LogicalType::LogicalType((LogicalType *)local_1c8,BOOLEAN);
  }
  if (local_1c8[0] == UNKNOWN) {
    LogicalType::LogicalType((LogicalType *)local_1a8,SQLNULL);
    uVar10 = local_1c8._16_8_;
    uVar9 = local_1c8._8_8_;
    local_1c8._0_2_ = local_1a8._0_2_;
    local_1c8._8_8_ = local_1a8._8_8_;
    local_1c8._16_8_ = local_198._0_8_;
    local_1a8._8_8_ = uVar9;
    local_198._0_8_ = uVar10;
    LogicalType::~LogicalType((LogicalType *)local_1a8);
  }
  this_01 = (BoundSubqueryExpression *)operator_new(200);
  LogicalType::LogicalType((LogicalType *)local_1a8,(LogicalType *)local_1c8);
  BoundSubqueryExpression::BoundSubqueryExpression(this_01,(LogicalType *)local_1a8);
  local_220._M_head_impl = this_01;
  LogicalType::~LogicalType((LogicalType *)local_1a8);
  if ((local_210->subquery_type == ANY) && (local_208._8_8_ != local_208._0_8_)) {
    __n = 0;
    do {
      this_02 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                              *)local_208,__n);
      expr_02 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*(this_02);
      GetExpressionReturnType(&local_100,expr_02);
      pBVar20 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                              *)(local_208 + 0x20));
      pvVar21 = vector<duckdb::LogicalType,_true>::operator[](&pBVar20->types,__n);
      LogicalType::LogicalType(&local_c8);
      bVar13 = LogicalType::TryGetMaxLogicalType
                         (*(ClientContext **)(local_208._40_8_ + 0x40),&local_100,pvVar21,&local_c8)
      ;
      if (!bVar13) {
        pBVar23 = (BinderException *)__cxa_allocate_exception(0x10);
        local_1a8._0_8_ = local_198;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,
                   "Cannot compare values of type %s and %s in IN/ANY/ALL clause - an explicit cast is required"
                   ,"");
        LogicalType::ToString_abi_cxx11_(&local_e8,&local_100);
        LogicalType::LogicalType(&local_118,pvVar21);
        BinderException::BinderException<std::__cxx11::string,duckdb::LogicalType>
                  (pBVar23,&local_210->super_ParsedExpression,(string *)local_1a8,&local_e8,
                   &local_118);
        __cxa_throw(pBVar23,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      context = *(ClientContext **)(local_208._40_8_ + 0x40);
      local_208._48_8_ =
           (this_02->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (this_02->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
      .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      BoundCastExpression::AddCastToType
                ((BoundCastExpression *)local_1a8,context,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 (local_208 + 0x30),&local_c8,false);
      uVar9 = local_1a8._0_8_;
      local_1a8._0_8_ = (_Hash_node_base *)0x0;
      _Var6._M_head_impl =
           (this_02->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (this_02->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
      .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar9;
      if (_Var6._M_head_impl != (Expression *)0x0) {
        (**(code **)(*(long *)&(_Var6._M_head_impl)->super_BaseExpression + 8))();
      }
      if ((_Hash_node_base *)local_1a8._0_8_ != (_Hash_node_base *)0x0) {
        (*(code *)(*(_Hash_node_base **)local_1a8._0_8_)[1]._M_nxt)();
      }
      local_1a8._0_8_ = (Expression *)0x0;
      if ((Expression *)local_208._48_8_ != (Expression *)0x0) {
        (*((BaseExpression *)local_208._48_8_)->_vptr_BaseExpression[1])();
      }
      local_208._48_8_ = 0;
      pBVar22 = unique_ptr<duckdb::BoundSubqueryExpression,_std::default_delete<duckdb::BoundSubqueryExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundSubqueryExpression,_std::default_delete<duckdb::BoundSubqueryExpression>,_true>
                              *)&local_220);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 &pBVar22->child_types,pvVar21);
      pBVar22 = unique_ptr<duckdb::BoundSubqueryExpression,_std::default_delete<duckdb::BoundSubqueryExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundSubqueryExpression,_std::default_delete<duckdb::BoundSubqueryExpression>,_true>
                              *)&local_220);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 &pBVar22->child_targets,&local_c8);
      pBVar22 = unique_ptr<duckdb::BoundSubqueryExpression,_std::default_delete<duckdb::BoundSubqueryExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundSubqueryExpression,_std::default_delete<duckdb::BoundSubqueryExpression>,_true>
                              *)&local_220);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&pBVar22->children,this_02);
      LogicalType::~LogicalType(&local_c8);
      LogicalType::~LogicalType(&local_100);
      __n = __n + 1;
    } while (__n < (ulong)((long)(local_208._8_8_ - local_208._0_8_) >> 3));
  }
  p_Var8 = local_218;
  pBVar22 = unique_ptr<duckdb::BoundSubqueryExpression,_std::default_delete<duckdb::BoundSubqueryExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundSubqueryExpression,_std::default_delete<duckdb::BoundSubqueryExpression>,_true>
                          *)&local_220);
  (pBVar22->binder).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_120;
  p_Var24 = (pBVar22->binder).internal.
            super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pBVar22->binder).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var8;
  if (p_Var24 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var24);
  }
  pBVar22 = unique_ptr<duckdb::BoundSubqueryExpression,_std::default_delete<duckdb::BoundSubqueryExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundSubqueryExpression,_std::default_delete<duckdb::BoundSubqueryExpression>,_true>
                          *)&local_220);
  uVar9 = local_208._32_8_;
  local_208._32_8_ = (long *)0x0;
  _Var7._M_head_impl =
       (pBVar22->subquery).
       super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t.
       super___uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>
       .super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl;
  (pBVar22->subquery).
  super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>.
  super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl = (BoundQueryNode *)uVar9;
  if (_Var7._M_head_impl != (BoundQueryNode *)0x0) {
    (**(code **)((long)(_Var7._M_head_impl)->_vptr_BoundQueryNode + 8))();
  }
  SVar1 = local_210->subquery_type;
  pBVar22 = unique_ptr<duckdb::BoundSubqueryExpression,_std::default_delete<duckdb::BoundSubqueryExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundSubqueryExpression,_std::default_delete<duckdb::BoundSubqueryExpression>,_true>
                          *)&local_220);
  pBVar22->subquery_type = SVar1;
  EVar2 = local_210->comparison_type;
  pBVar22 = unique_ptr<duckdb::BoundSubqueryExpression,_std::default_delete<duckdb::BoundSubqueryExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundSubqueryExpression,_std::default_delete<duckdb::BoundSubqueryExpression>,_true>
                          *)&local_220);
  local_1d0._M_head_impl = &(local_220._M_head_impl)->super_Expression;
  pBVar22->comparison_type = EVar2;
  local_220._M_head_impl = (BoundSubqueryExpression *)0x0;
  BindResult::BindResult
            ((BindResult *)local_1c8._24_8_,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_1d0);
  if ((BoundSubqueryExpression *)local_1d0._M_head_impl != (BoundSubqueryExpression *)0x0) {
    (*(((Expression *)&(local_1d0._M_head_impl)->super_BaseExpression)->super_BaseExpression).
      _vptr_BaseExpression[1])();
  }
  local_1d0._M_head_impl = (Expression *)0x0;
  if (local_220._M_head_impl != (BoundSubqueryExpression *)0x0) {
    (*((local_220._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])();
  }
  LogicalType::~LogicalType((LogicalType *)local_1c8);
  if ((long *)local_208._32_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_208._32_8_ + 8))();
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)local_208);
  return (BindResult *)local_1c8._24_8_;
}

Assistant:

BindResult ExpressionBinder::BindExpression(SubqueryExpression &expr, idx_t depth) {
	if (expr.subquery->node->type != QueryNodeType::BOUND_SUBQUERY_NODE) {
		// first bind the actual subquery in a new binder
		auto subquery_binder = Binder::CreateBinder(context, &binder);
		subquery_binder->can_contain_nulls = true;
		auto bound_node = subquery_binder->BindNode(*expr.subquery->node);
		// check the correlated columns of the subquery for correlated columns with depth > 1
		for (idx_t i = 0; i < subquery_binder->correlated_columns.size(); i++) {
			CorrelatedColumnInfo corr = subquery_binder->correlated_columns[i];
			if (corr.depth > 1) {
				// depth > 1, the column references the query ABOVE the current one
				// add to the set of correlated columns for THIS query
				corr.depth -= 1;
				binder.AddCorrelatedColumn(corr);
			}
		}
		auto prior_subquery = std::move(expr.subquery);
		expr.subquery = make_uniq<SelectStatement>();
		expr.subquery->node =
		    make_uniq<BoundSubqueryNode>(std::move(subquery_binder), std::move(bound_node), std::move(prior_subquery));
	}
	// now bind the child node of the subquery
	if (expr.child) {
		// first bind the children of the subquery, if any
		auto error = Bind(expr.child, depth);
		if (error.HasError()) {
			return BindResult(std::move(error));
		}
	}
	auto &bound_subquery = expr.subquery->node->Cast<BoundSubqueryNode>();
	vector<unique_ptr<Expression>> child_expressions;
	if (expr.subquery_type != SubqueryType::EXISTS) {
		idx_t expected_columns = 1;
		if (expr.child) {
			auto &child = BoundExpression::GetExpression(*expr.child);
			ExtractSubqueryChildren(child, child_expressions, bound_subquery.bound_node->types);
			if (child_expressions.empty()) {
				child_expressions.push_back(std::move(child));
			}
			expected_columns = child_expressions.size();
		}
		if (bound_subquery.bound_node->types.size() != expected_columns) {
			throw BinderException(expr, "Subquery returns %zu columns - expected %d",
			                      bound_subquery.bound_node->types.size(), expected_columns);
		}
	}
	// both binding the child and binding the subquery was successful
	D_ASSERT(expr.subquery->node->type == QueryNodeType::BOUND_SUBQUERY_NODE);
	auto subquery_binder = std::move(bound_subquery.subquery_binder);
	auto bound_node = std::move(bound_subquery.bound_node);
	LogicalType return_type =
	    expr.subquery_type == SubqueryType::SCALAR ? bound_node->types[0] : LogicalType(LogicalTypeId::BOOLEAN);
	if (return_type.id() == LogicalTypeId::UNKNOWN) {
		return_type = LogicalType::SQLNULL;
	}

	auto result = make_uniq<BoundSubqueryExpression>(return_type);
	if (expr.subquery_type == SubqueryType::ANY) {
		// ANY comparison
		// cast child and subquery child to equivalent types
		for (idx_t child_idx = 0; child_idx < child_expressions.size(); child_idx++) {
			auto &child = child_expressions[child_idx];
			auto child_type = ExpressionBinder::GetExpressionReturnType(*child);
			auto &subquery_type = bound_node->types[child_idx];
			LogicalType compare_type;
			if (!LogicalType::TryGetMaxLogicalType(context, child_type, subquery_type, compare_type)) {
				throw BinderException(
				    expr, "Cannot compare values of type %s and %s in IN/ANY/ALL clause - an explicit cast is required",
				    child_type.ToString(), subquery_type);
			}
			child = BoundCastExpression::AddCastToType(context, std::move(child), compare_type);
			result->child_types.push_back(subquery_type);
			result->child_targets.push_back(compare_type);
			result->children.push_back(std::move(child));
		}
	}
	result->binder = std::move(subquery_binder);
	result->subquery = std::move(bound_node);
	result->subquery_type = expr.subquery_type;
	result->comparison_type = expr.comparison_type;

	return BindResult(std::move(result));
}